

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void monty_export_into(MontyContext *mc,mp_int *r,mp_int *x)

{
  undefined1 local_30 [8];
  mp_int reduced;
  mp_int *x_local;
  mp_int *r_local;
  MontyContext *mc_local;
  
  reduced.w = &x->nw;
  if (x->nw <= mc->rw * 2) {
    _local_30 = monty_reduce_internal(mc,x,*mc->scratch);
    mp_copy_into(r,(mp_int *)local_30);
    mp_clear(mc->scratch);
    return;
  }
  __assert_fail("x->nw <= 2*mc->rw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x601,"void monty_export_into(MontyContext *, mp_int *, mp_int *)");
}

Assistant:

void monty_export_into(MontyContext *mc, mp_int *r, mp_int *x)
{
    assert(x->nw <= 2*mc->rw);
    mp_int reduced = monty_reduce_internal(mc, x, *mc->scratch);
    mp_copy_into(r, &reduced);
    mp_clear(mc->scratch);
}